

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  cmExpandedCommandArgument *argument;
  _List_node_base *p_Var1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  cmState *this_00;
  cmCommand *pcVar5;
  cmTarget *pcVar6;
  char *pcVar7;
  cmConditionEvaluator *pcVar8;
  string *psVar9;
  cmMakefile *pcVar10;
  _Self __tmp;
  _List_node_base *p_Var11;
  _Self __tmp_1;
  PolicyID pid;
  int reducible;
  iterator argP2;
  iterator arg;
  allocator local_79;
  undefined1 local_78 [16];
  undefined8 local_68;
  int local_54;
  iterator local_50;
  _Base_ptr local_48;
  iterator local_40;
  iterator local_38;
  
  local_48 = (_Base_ptr)this;
  do {
    local_54 = 0;
    p_Var11 = (newArgs->
              super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    local_40._M_node = (_List_node_base *)0x0;
    if (p_Var11 == (_List_node_base *)newArgs) {
      return true;
    }
    do {
      local_50._M_node = p_Var11;
      if ((p_Var11 != (_List_node_base *)newArgs) &&
         (local_50._M_node =
               (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
         local_40._M_node = local_50._M_node, local_50._M_node != (_List_node_base *)newArgs)) {
        local_40._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_50._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      }
      iVar2._M_node = local_50._M_node;
      local_78._0_8_ = &stack0xffffffffffffff98;
      local_38._M_node = p_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"EXISTS","");
      argument = (cmExpandedCommandArgument *)(p_Var11 + 1);
      bVar3 = IsKeyword((cmConditionEvaluator *)local_48,(string *)local_78,argument);
      if (bVar3) {
        if ((undefined8 *)local_78._0_8_ != &stack0xffffffffffffff98) {
          operator_delete((void *)local_78._0_8_,local_68 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar8 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar3 = cmsys::SystemTools::FileExists((char *)pcVar8);
          HandlePredicate(pcVar8,bVar3,&stack0xffffffffffffffac,&stack0xffffffffffffffc8,newArgs,
                          &stack0xffffffffffffffb0,&stack0xffffffffffffffc0);
        }
      }
      else if ((undefined8 *)local_78._0_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)local_78._0_8_,local_68 + 1);
      }
      local_78._0_8_ = (cmConditionEvaluator *)&stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"IS_DIRECTORY","");
      bVar3 = IsKeyword((cmConditionEvaluator *)local_48,(string *)local_78,argument);
      iVar2._M_node = local_50._M_node;
      if (bVar3) {
        if ((cmConditionEvaluator *)local_78._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff98) {
          operator_delete((void *)local_78._0_8_,local_68 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          std::__cxx11::string::string
                    ((string *)local_78,(char *)iVar2._M_node[1]._M_next,&local_79);
          psVar9 = (string *)local_78;
          bVar3 = cmsys::SystemTools::FileIsDirectory((string *)local_78);
          HandlePredicate((cmConditionEvaluator *)psVar9,bVar3,&stack0xffffffffffffffac,
                          &stack0xffffffffffffffc8,newArgs,&stack0xffffffffffffffb0,
                          &stack0xffffffffffffffc0);
          goto LAB_002664d0;
        }
      }
      else {
LAB_002664d0:
        if ((cmConditionEvaluator *)local_78._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff98) {
          operator_delete((void *)local_78._0_8_,local_68 + 1);
        }
      }
      local_78._0_8_ = (cmConditionEvaluator *)&stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"IS_SYMLINK","");
      bVar3 = IsKeyword((cmConditionEvaluator *)local_48,(string *)local_78,argument);
      iVar2._M_node = local_50._M_node;
      if (bVar3) {
        if ((cmConditionEvaluator *)local_78._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff98) {
          operator_delete((void *)local_78._0_8_,local_68 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          std::__cxx11::string::string
                    ((string *)local_78,(char *)iVar2._M_node[1]._M_next,&local_79);
          psVar9 = (string *)local_78;
          bVar3 = cmsys::SystemTools::FileIsSymlink((string *)local_78);
          HandlePredicate((cmConditionEvaluator *)psVar9,bVar3,&stack0xffffffffffffffac,
                          &stack0xffffffffffffffc8,newArgs,&stack0xffffffffffffffb0,
                          &stack0xffffffffffffffc0);
          goto LAB_00266573;
        }
      }
      else {
LAB_00266573:
        if ((cmConditionEvaluator *)local_78._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff98) {
          operator_delete((void *)local_78._0_8_,local_68 + 1);
        }
      }
      local_78._0_8_ = (cmConditionEvaluator *)&stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"IS_ABSOLUTE","");
      bVar3 = IsKeyword((cmConditionEvaluator *)local_48,(string *)local_78,argument);
      iVar2._M_node = local_50._M_node;
      if (bVar3) {
        if ((cmConditionEvaluator *)local_78._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff98) {
          operator_delete((void *)local_78._0_8_,local_68 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar8 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar3 = cmsys::SystemTools::FileIsFullPath((char *)pcVar8);
          HandlePredicate(pcVar8,bVar3,&stack0xffffffffffffffac,&stack0xffffffffffffffc8,newArgs,
                          &stack0xffffffffffffffb0,&stack0xffffffffffffffc0);
        }
      }
      else if ((cmConditionEvaluator *)local_78._0_8_ !=
               (cmConditionEvaluator *)&stack0xffffffffffffff98) {
        operator_delete((void *)local_78._0_8_,local_68 + 1);
      }
      local_78._0_8_ = (cmConditionEvaluator *)&stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"COMMAND","");
      bVar3 = IsKeyword((cmConditionEvaluator *)local_48,(string *)local_78,argument);
      iVar2._M_node = local_50._M_node;
      if (bVar3) {
        if ((cmConditionEvaluator *)local_78._0_8_ !=
            (cmConditionEvaluator *)&stack0xffffffffffffff98) {
          operator_delete((void *)local_78._0_8_,local_68 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          this_00 = cmMakefile::GetState(*(cmMakefile **)local_48);
          std::__cxx11::string::string
                    ((string *)local_78,(char *)iVar2._M_node[1]._M_next,&local_79);
          pcVar5 = cmState::GetCommand(this_00,(string *)local_78);
          pcVar8 = (cmConditionEvaluator *)local_78._0_8_;
          if ((cmConditionEvaluator *)local_78._0_8_ !=
              (cmConditionEvaluator *)&stack0xffffffffffffff98) {
            operator_delete((void *)local_78._0_8_,local_68 + 1);
          }
          HandlePredicate(pcVar8,pcVar5 != (cmCommand *)0x0,&stack0xffffffffffffffac,
                          &stack0xffffffffffffffc8,newArgs,&stack0xffffffffffffffb0,
                          &stack0xffffffffffffffc0);
        }
      }
      else if ((cmConditionEvaluator *)local_78._0_8_ !=
               (cmConditionEvaluator *)&stack0xffffffffffffff98) {
        operator_delete((void *)local_78._0_8_,local_68 + 1);
      }
      local_78._0_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"POLICY","");
      bVar3 = IsKeyword((cmConditionEvaluator *)local_48,(string *)local_78,argument);
      iVar2._M_node = local_50._M_node;
      if (bVar3) {
        if ((undefined8 *)local_78._0_8_ != &stack0xffffffffffffff98) {
          operator_delete((void *)local_78._0_8_,local_68 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar8 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar3 = cmPolicies::GetPolicyID((char *)pcVar8,(PolicyID *)local_78);
          HandlePredicate(pcVar8,bVar3,&stack0xffffffffffffffac,&stack0xffffffffffffffc8,newArgs,
                          &stack0xffffffffffffffb0,&stack0xffffffffffffffc0);
        }
      }
      else if ((undefined8 *)local_78._0_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)local_78._0_8_,local_68 + 1);
      }
      local_78._0_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"TARGET","");
      bVar3 = IsKeyword((cmConditionEvaluator *)local_48,(string *)local_78,argument);
      iVar2._M_node = local_50._M_node;
      if (bVar3) {
        if ((undefined8 *)local_78._0_8_ != &stack0xffffffffffffff98) {
          operator_delete((void *)local_78._0_8_,local_68 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar10 = *(cmMakefile **)local_48;
          pcVar6 = cmMakefile::FindTargetToUse(pcVar10,(string *)(iVar2._M_node + 1),false);
          HandlePredicate((cmConditionEvaluator *)pcVar10,pcVar6 != (cmTarget *)0x0,
                          &stack0xffffffffffffffac,&stack0xffffffffffffffc8,newArgs,
                          &stack0xffffffffffffffb0,&stack0xffffffffffffffc0);
        }
      }
      else if ((undefined8 *)local_78._0_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)local_78._0_8_,local_68 + 1);
      }
      local_78._0_8_ = (cmMakefile *)&stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"DEFINED","");
      bVar3 = IsKeyword((cmConditionEvaluator *)local_48,(string *)local_78,argument);
      iVar2._M_node = local_50._M_node;
      if (bVar3) {
        if ((cmMakefile *)local_78._0_8_ != (cmMakefile *)&stack0xffffffffffffff98) {
          operator_delete((void *)local_78._0_8_,local_68 + 1);
        }
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          p_Var1 = iVar2._M_node[1]._M_prev;
          psVar9 = (string *)(iVar2._M_node + 1);
          if (p_Var1 < (_List_node_base *)0x5) {
LAB_00266971:
            pcVar10 = *(cmMakefile **)local_48;
            bVar3 = cmMakefile::IsDefinitionSet(pcVar10,psVar9);
          }
          else {
            bVar3 = false;
            std::__cxx11::string::substr((ulong)local_78,(ulong)psVar9);
            iVar4 = std::__cxx11::string::compare((char *)local_78);
            if (iVar4 == 0) {
              bVar3 = ((psVar9->_M_dataplus)._M_p + -1)[(long)p_Var1] == '}';
            }
            if ((cmMakefile *)local_78._0_8_ != (cmMakefile *)&stack0xffffffffffffff98) {
              operator_delete((void *)local_78._0_8_,local_68 + 1);
            }
            if (!bVar3) goto LAB_00266971;
            std::__cxx11::string::substr((ulong)local_78,(ulong)psVar9);
            pcVar7 = cmsys::SystemTools::GetEnv((char *)local_78._0_8_);
            bVar3 = pcVar7 != (char *)0x0;
            pcVar10 = (cmMakefile *)local_78._0_8_;
            if ((cmMakefile *)local_78._0_8_ != (cmMakefile *)&stack0xffffffffffffff98) {
              operator_delete((void *)local_78._0_8_,local_68 + 1);
            }
          }
          HandlePredicate((cmConditionEvaluator *)pcVar10,bVar3,&stack0xffffffffffffffac,
                          &stack0xffffffffffffffc8,newArgs,&stack0xffffffffffffffb0,
                          &stack0xffffffffffffffc0);
        }
      }
      else if ((cmMakefile *)local_78._0_8_ != (cmMakefile *)&stack0xffffffffffffff98) {
        operator_delete((void *)local_78._0_8_,local_68 + 1);
      }
      p_Var11 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                   *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var11 != (_List_node_base *)newArgs);
    if (local_54 == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList &newArgs,
                  std::string &, cmake::MessageType &)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      // does a file exist
      if (this->IsKeyword("EXISTS", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileExists(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a directory with this name exist
      if (this->IsKeyword("IS_DIRECTORY", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsDirectory(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a symlink with this name exist
      if (this->IsKeyword("IS_SYMLINK", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsSymlink(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // is the given path an absolute path ?
      if (this->IsKeyword("IS_ABSOLUTE", *arg) && argP1  != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsFullPath(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a command exist
      if (this->IsKeyword("COMMAND", *arg) && argP1  != newArgs.end())
        {
        cmCommand* command =
            this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(
          command ? true : false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a policy exist
      if (this->IsKeyword("POLICY", *arg) && argP1 != newArgs.end())
        {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(
          cmPolicies::GetPolicyID(argP1->c_str(), pid),
            reducible, arg, newArgs, argP1, argP2);
        }
      // does a target exist
      if (this->IsKeyword("TARGET", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue())?true:false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // is a variable defined
      if (this->IsKeyword("DEFINED", *arg) && argP1  != newArgs.end())
        {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if(argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
           argP1->GetValue().operator[](argP1len-1) == '}')
          {
          std::string env = argP1->GetValue().substr(4, argP1len-5);
          bdef = cmSystemTools::GetEnv(env.c_str())?true:false;
          }
        else
          {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
          }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}